

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O2

string * __thiscall
plot::TerminalInfo::query<void>
          (string *__return_storage_ptr__,TerminalInfo *this,string_view cmd,string_view terminator)

{
  char __c;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ssize_t sVar4;
  size_type sVar5;
  size_type *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char ch;
  int available;
  _Alloc_hider local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  termios oldAttrs;
  string_view terminator_local;
  tcsetattr_guard local_b0;
  
  terminator_local._M_str = terminator._M_str;
  terminator_local._M_len = terminator._M_len;
  iVar2 = tcgetattr(this->term_,(termios *)&oldAttrs);
  if (iVar2 != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_b0.new_.c_lflag = oldAttrs.c_lflag & 0xfffffff5;
  local_b0.term = this->term_;
  local_b0.ok = false;
  local_b0.old.c_iflag = oldAttrs.c_iflag;
  local_b0.old.c_oflag = oldAttrs.c_oflag;
  local_b0.old.c_cc[7] = oldAttrs.c_cc[7];
  local_b0.old.c_cc[8] = oldAttrs.c_cc[8];
  local_b0.old.c_cc[9] = oldAttrs.c_cc[9];
  local_b0.old.c_cc[10] = oldAttrs.c_cc[10];
  local_b0.old.c_cc[0xb] = oldAttrs.c_cc[0xb];
  local_b0.old.c_cc[0xc] = oldAttrs.c_cc[0xc];
  local_b0.old.c_cc[0xd] = oldAttrs.c_cc[0xd];
  local_b0.old.c_cc[0xe] = oldAttrs.c_cc[0xe];
  local_b0.old.c_cc[0xf] = oldAttrs.c_cc[0xf];
  local_b0.old.c_cc[0x10] = oldAttrs.c_cc[0x10];
  local_b0.old.c_cc[0x11] = oldAttrs.c_cc[0x11];
  local_b0.old.c_cc[0x12] = oldAttrs.c_cc[0x12];
  local_b0.old.c_cc[0x13] = oldAttrs.c_cc[0x13];
  local_b0.old.c_cc[0x14] = oldAttrs.c_cc[0x14];
  local_b0.old.c_cc[0x15] = oldAttrs.c_cc[0x15];
  local_b0.old.c_cc[0x16] = oldAttrs.c_cc[0x16];
  local_b0.new_.c_iflag = oldAttrs.c_iflag;
  local_b0.new_.c_oflag = oldAttrs.c_oflag;
  local_b0.new_.c_cflag = oldAttrs.c_cflag;
  local_b0.new_.c_line = oldAttrs.c_line;
  local_b0.new_.c_cc[0] = oldAttrs.c_cc[0];
  local_b0.new_.c_cc[1] = oldAttrs.c_cc[1];
  local_b0.new_.c_cc[2] = oldAttrs.c_cc[2];
  local_b0.new_.c_cc[3] = oldAttrs.c_cc[3];
  local_b0.new_.c_cc[4] = oldAttrs.c_cc[4];
  local_b0.new_.c_cc[5] = '\0';
  local_b0.new_.c_cc[6] = '\0';
  local_b0.new_.c_ospeed = oldAttrs.c_ospeed;
  local_b0.new_.c_cc[7] = oldAttrs.c_cc[7];
  local_b0.new_.c_cc[8] = oldAttrs.c_cc[8];
  local_b0.new_.c_cc[9] = oldAttrs.c_cc[9];
  local_b0.new_.c_cc[10] = oldAttrs.c_cc[10];
  local_b0.new_.c_cc[0xb] = oldAttrs.c_cc[0xb];
  local_b0.new_.c_cc[0xc] = oldAttrs.c_cc[0xc];
  local_b0.new_.c_cc[0xd] = oldAttrs.c_cc[0xd];
  local_b0.new_.c_cc[0xe] = oldAttrs.c_cc[0xe];
  local_b0.new_.c_cc[0xf] = oldAttrs.c_cc[0xf];
  local_b0.new_.c_cc[0x10] = oldAttrs.c_cc[0x10];
  local_b0.new_.c_cc[0x11] = oldAttrs.c_cc[0x11];
  local_b0.new_.c_cc[0x12] = oldAttrs.c_cc[0x12];
  local_b0.new_.c_cc[0x13] = oldAttrs.c_cc[0x13];
  local_b0.new_.c_cc[0x14] = oldAttrs.c_cc[0x14];
  local_b0.new_.c_cc[0x15] = oldAttrs.c_cc[0x15];
  local_b0.new_.c_cc[0x16] = oldAttrs.c_cc[0x16];
  bVar1 = detail::tcsetattr_guard::set(&local_b0);
  if ((((bVar1) && (iVar2 = tcdrain(this->term_), iVar2 == 0)) &&
      (iVar2 = tcflush(this->term_,0), iVar2 == 0)) &&
     (sVar3 = write(this->term_,cmd._M_str,cmd._M_len), sVar3 == cmd._M_len)) {
    local_120._M_p = (pointer)0x64;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&local_120);
    available = 0;
    iVar2 = ioctl(this->term_,0x541b);
    if (iVar2 == 0) {
      paVar7 = &local_110;
      local_118 = 0;
      local_110._M_local_buf[0] = '\0';
      local_120._M_p = (pointer)paVar7;
      while (available != 0) {
        std::__cxx11::string::reserve((ulong)&local_120);
        for (; 0 < available; available = available + -1) {
          ch = '\0';
          sVar4 = read(this->term_,&ch,1);
          __c = ch;
          if (sVar4 != 1) {
            paVar7 = &__return_storage_ptr__->field_2;
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar7;
            psVar6 = &__return_storage_ptr__->_M_string_length;
LAB_0010444b:
            *psVar6 = 0;
            paVar7->_M_local_buf[0] = '\0';
            goto LAB_00104453;
          }
          if (local_118 != 0 || ch == '\x1b') {
            std::__cxx11::string::append((ulong)&local_120,'\x01');
            sVar5 = std::experimental::fundamentals_v1::
                    basic_string_view<char,_std::char_traits<char>_>::find(&terminator_local,__c,0);
            if (sVar5 != 0xffffffffffffffff) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_p == paVar7) {
                (__return_storage_ptr__->field_2)._M_allocated_capacity =
                     CONCAT71(local_110._M_allocated_capacity._1_7_,local_110._M_local_buf[0]);
                *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_110._8_8_;
              }
              else {
                (__return_storage_ptr__->_M_dataplus)._M_p = local_120._M_p;
                (__return_storage_ptr__->field_2)._M_allocated_capacity =
                     CONCAT71(local_110._M_allocated_capacity._1_7_,local_110._M_local_buf[0]);
              }
              __return_storage_ptr__->_M_string_length = local_118;
              psVar6 = &local_118;
              local_120._M_p = (pointer)paVar7;
              goto LAB_0010444b;
            }
          }
        }
        if ((local_118 != 0) && (iVar2 = ioctl(this->term_,0x541b,&available), iVar2 != 0)) break;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00104453:
      std::__cxx11::string::~string((string *)&local_120);
      goto LAB_001042f8;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_001042f8:
  detail::tcsetattr_guard::~tcsetattr_guard(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string TerminalInfo::query(string_view cmd, string_view terminator) {
    struct termios oldAttrs;
    if (tcgetattr(term_, &oldAttrs))
        return std::string();

    struct termios newAttrs = oldAttrs;
    newAttrs.c_lflag &= ~(ECHO | ICANON);
    newAttrs.c_cc[VMIN] = 0;
    newAttrs.c_cc[VTIME] = 0;

    detail::tcsetattr_guard guard(term_, oldAttrs, newAttrs);
    if (!guard.set())
        return std::string();

    if (tcdrain(term_))
        return std::string();

    if (tcflush(term_, TCIFLUSH))
        return std::string();

    if (std::size_t(write(term_, cmd.data(), cmd.size())) != cmd.size())
        return std::string();

    // FIXME: This won't be enough for remote terminals (e.g. SSH)
    using namespace std::chrono_literals;
    std::this_thread::sleep_for(100ms);

    int available = 0;
    if (ioctl(term_, FIONREAD, &available))
        return std::string();

    std::string result;

    while (available) {
        result.reserve(result.size() + available);

        for (; available > 0; --available) {
            char ch = '\0';
            if (read(term_, &ch, 1) != 1)
                return std::string();

            if (!result.empty() || ch == '\x1b') {
                result.append(1, ch);
                if (terminator.find(ch) != string_view::npos)
                    return result;
            }
        }

        // If we found an escape character but no terminator, continue reading
        if (!result.empty())
            if (ioctl(term_, FIONREAD, &available))
                return std::string();
    }

    return std::string();
}